

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx512::SubGridIntersectorKMoeller<4,_8,_true>,_true>
     ::intersect(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,RayQueryContext *context)

{
  BVH *bvh;
  bool bVar1;
  ulong uVar2;
  size_t k;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  byte bVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  Precalculations pre;
  TravRayK<8,_false> tray;
  Precalculations local_291;
  RayHitK<8> *local_290;
  Intersectors *local_288;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_280;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined4 uStack_144;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined4 uStack_104;
  int local_100;
  int iStack_fc;
  int iStack_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int iStack_e8;
  int iStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  uint local_c0;
  uint uStack_bc;
  uint uStack_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint uStack_a8;
  uint uStack_a4;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    local_290 = ray;
    local_288 = This;
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar11 = vpcmpeqd_avx2(in_ZMM0._0_32_,in_ZMM0._0_32_);
      uVar6 = vpcmpeqd_avx512vl(auVar11,(undefined1  [32])valid_i->field_0);
      bVar7 = (byte)uVar6;
      if (bVar7 != 0) {
        local_280._0_4_ = *(undefined4 *)ray;
        local_280._4_4_ = *(undefined4 *)(ray + 4);
        local_280._8_4_ = *(undefined4 *)(ray + 8);
        local_280._12_4_ = *(undefined4 *)(ray + 0xc);
        local_280._16_4_ = *(undefined4 *)(ray + 0x10);
        local_280._20_4_ = *(undefined4 *)(ray + 0x14);
        local_280._24_4_ = *(undefined4 *)(ray + 0x18);
        local_280._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_280._32_4_ = *(undefined4 *)(ray + 0x20);
        local_280._36_4_ = *(undefined4 *)(ray + 0x24);
        local_280._40_4_ = *(undefined4 *)(ray + 0x28);
        local_280._44_4_ = *(undefined4 *)(ray + 0x2c);
        local_280._48_4_ = *(undefined4 *)(ray + 0x30);
        local_280._52_4_ = *(undefined4 *)(ray + 0x34);
        local_280._56_4_ = *(undefined4 *)(ray + 0x38);
        local_280._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_280._64_4_ = *(undefined4 *)(ray + 0x40);
        local_280._68_4_ = *(undefined4 *)(ray + 0x44);
        local_280._72_4_ = *(undefined4 *)(ray + 0x48);
        local_280._76_4_ = *(undefined4 *)(ray + 0x4c);
        local_280._80_4_ = *(undefined4 *)(ray + 0x50);
        local_280._84_4_ = *(undefined4 *)(ray + 0x54);
        local_280._88_4_ = *(undefined4 *)(ray + 0x58);
        local_280._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_220 = *(undefined1 (*) [32])(ray + 0x80);
        local_200 = *(undefined1 (*) [32])(ray + 0xa0);
        local_1e0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar9._8_4_ = 0x7fffffff;
        auVar9._0_8_ = 0x7fffffff7fffffff;
        auVar9._12_4_ = 0x7fffffff;
        auVar9._16_4_ = 0x7fffffff;
        auVar9._20_4_ = 0x7fffffff;
        auVar9._24_4_ = 0x7fffffff;
        auVar9._28_4_ = 0x7fffffff;
        auVar12._8_4_ = 0x219392ef;
        auVar12._0_8_ = 0x219392ef219392ef;
        auVar12._12_4_ = 0x219392ef;
        auVar12._16_4_ = 0x219392ef;
        auVar12._20_4_ = 0x219392ef;
        auVar12._24_4_ = 0x219392ef;
        auVar12._28_4_ = 0x219392ef;
        auVar11 = vandps_avx(local_220,auVar9);
        uVar2 = vcmpps_avx512vl(auVar11,auVar12,1);
        bVar1 = (bool)((byte)uVar2 & 1);
        auVar10._0_4_ = (uint)bVar1 * 0x219392ef | (uint)!bVar1 * local_220._0_4_;
        bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
        auVar10._4_4_ = (uint)bVar1 * 0x219392ef | (uint)!bVar1 * local_220._4_4_;
        bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
        auVar10._8_4_ = (uint)bVar1 * 0x219392ef | (uint)!bVar1 * local_220._8_4_;
        bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
        auVar10._12_4_ = (uint)bVar1 * 0x219392ef | (uint)!bVar1 * local_220._12_4_;
        bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
        auVar10._16_4_ = (uint)bVar1 * 0x219392ef | (uint)!bVar1 * local_220._16_4_;
        bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
        auVar10._20_4_ = (uint)bVar1 * 0x219392ef | (uint)!bVar1 * local_220._20_4_;
        bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
        auVar10._24_4_ = (uint)bVar1 * 0x219392ef | (uint)!bVar1 * local_220._24_4_;
        bVar1 = SUB81(uVar2 >> 7,0);
        auVar10._28_4_ = (uint)bVar1 * 0x219392ef | (uint)!bVar1 * local_220._28_4_;
        auVar11 = vandps_avx(local_200,auVar9);
        uVar2 = vcmpps_avx512vl(auVar11,auVar12,1);
        bVar1 = (bool)((byte)uVar2 & 1);
        auVar8._0_4_ = (uint)bVar1 * 0x219392ef | (uint)!bVar1 * local_200._0_4_;
        bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
        auVar8._4_4_ = (uint)bVar1 * 0x219392ef | (uint)!bVar1 * local_200._4_4_;
        bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
        auVar8._8_4_ = (uint)bVar1 * 0x219392ef | (uint)!bVar1 * local_200._8_4_;
        bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
        auVar8._12_4_ = (uint)bVar1 * 0x219392ef | (uint)!bVar1 * local_200._12_4_;
        bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
        auVar8._16_4_ = (uint)bVar1 * 0x219392ef | (uint)!bVar1 * local_200._16_4_;
        bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
        auVar8._20_4_ = (uint)bVar1 * 0x219392ef | (uint)!bVar1 * local_200._20_4_;
        bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
        auVar8._24_4_ = (uint)bVar1 * 0x219392ef | (uint)!bVar1 * local_200._24_4_;
        bVar1 = SUB81(uVar2 >> 7,0);
        auVar8._28_4_ = (uint)bVar1 * 0x219392ef | (uint)!bVar1 * local_200._28_4_;
        auVar11 = vandps_avx(local_1e0,auVar9);
        uVar2 = vcmpps_avx512vl(auVar11,auVar12,1);
        bVar1 = (bool)((byte)uVar2 & 1);
        auVar11._0_4_ = (uint)bVar1 * 0x219392ef | (uint)!bVar1 * local_1e0._0_4_;
        bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
        auVar11._4_4_ = (uint)bVar1 * 0x219392ef | (uint)!bVar1 * local_1e0._4_4_;
        bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
        auVar11._8_4_ = (uint)bVar1 * 0x219392ef | (uint)!bVar1 * local_1e0._8_4_;
        bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
        auVar11._12_4_ = (uint)bVar1 * 0x219392ef | (uint)!bVar1 * local_1e0._12_4_;
        bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
        auVar11._16_4_ = (uint)bVar1 * 0x219392ef | (uint)!bVar1 * local_1e0._16_4_;
        bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
        auVar11._20_4_ = (uint)bVar1 * 0x219392ef | (uint)!bVar1 * local_1e0._20_4_;
        bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
        auVar11._24_4_ = (uint)bVar1 * 0x219392ef | (uint)!bVar1 * local_1e0._24_4_;
        bVar1 = SUB81(uVar2 >> 7,0);
        auVar11._28_4_ = (uint)bVar1 * 0x219392ef | (uint)!bVar1 * local_1e0._28_4_;
        auVar9 = vrcp14ps_avx512vl(auVar10);
        auVar13._8_4_ = 0x3f800000;
        auVar13._0_8_ = 0x3f8000003f800000;
        auVar13._12_4_ = 0x3f800000;
        auVar13._16_4_ = 0x3f800000;
        auVar13._20_4_ = 0x3f800000;
        auVar13._24_4_ = 0x3f800000;
        auVar13._28_4_ = 0x3f800000;
        auVar3 = vfnmadd213ps_fma(auVar10,auVar9,auVar13);
        auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar9,auVar9);
        auVar10 = vrcp14ps_avx512vl(auVar8);
        auVar4 = vfnmadd213ps_fma(auVar8,auVar10,auVar13);
        auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar10,auVar10);
        auVar10 = vrcp14ps_avx512vl(auVar11);
        auVar5 = vfnmadd213ps_fma(auVar11,auVar10,auVar13);
        local_1c0 = ZEXT1632(auVar3);
        local_1a0 = ZEXT1632(auVar4);
        auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar10,auVar10);
        local_180 = ZEXT1632(auVar5);
        local_160 = (float)local_280._0_4_ * auVar3._0_4_;
        fStack_15c = (float)local_280._4_4_ * auVar3._4_4_;
        fStack_158 = (float)local_280._8_4_ * auVar3._8_4_;
        fStack_154 = (float)local_280._12_4_ * auVar3._12_4_;
        fStack_150 = (float)local_280._16_4_ * 0.0;
        fStack_14c = (float)local_280._20_4_ * 0.0;
        fStack_148 = (float)local_280._24_4_ * 0.0;
        local_140 = (float)local_280._32_4_ * auVar4._0_4_;
        fStack_13c = (float)local_280._36_4_ * auVar4._4_4_;
        fStack_138 = (float)local_280._40_4_ * auVar4._8_4_;
        fStack_134 = (float)local_280._44_4_ * auVar4._12_4_;
        fStack_130 = (float)local_280._48_4_ * 0.0;
        fStack_12c = (float)local_280._52_4_ * 0.0;
        fStack_128 = (float)local_280._56_4_ * 0.0;
        local_120 = (float)local_280._64_4_ * auVar5._0_4_;
        fStack_11c = (float)local_280._68_4_ * auVar5._4_4_;
        fStack_118 = (float)local_280._72_4_ * auVar5._8_4_;
        fStack_114 = (float)local_280._76_4_ * auVar5._12_4_;
        fStack_110 = (float)local_280._80_4_ * 0.0;
        fStack_10c = (float)local_280._84_4_ * 0.0;
        fStack_108 = (float)local_280._88_4_ * 0.0;
        uVar2 = vcmpps_avx512vl(ZEXT1632(auVar3),ZEXT832(0) << 0x20,1);
        auVar11 = vpbroadcastd_avx512vl(ZEXT416(0x10));
        local_100 = (uint)((byte)uVar2 & 1) * auVar11._0_4_;
        iStack_fc = (uint)((byte)(uVar2 >> 1) & 1) * auVar11._4_4_;
        iStack_f8 = (uint)((byte)(uVar2 >> 2) & 1) * auVar11._8_4_;
        iStack_f4 = (uint)((byte)(uVar2 >> 3) & 1) * auVar11._12_4_;
        iStack_f0 = (uint)((byte)(uVar2 >> 4) & 1) * auVar11._16_4_;
        iStack_ec = (uint)((byte)(uVar2 >> 5) & 1) * auVar11._20_4_;
        iStack_e8 = (uint)((byte)(uVar2 >> 6) & 1) * auVar11._24_4_;
        iStack_e4 = (uint)(byte)(uVar2 >> 7) * auVar11._28_4_;
        uVar2 = vcmpps_avx512vl(ZEXT1632(auVar4),ZEXT832(0) << 0x20,5);
        auVar11 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        bVar1 = (bool)((byte)uVar2 & 1);
        local_e0 = (uint)bVar1 * auVar11._0_4_ | (uint)!bVar1 * 0x30;
        bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
        uStack_dc = (uint)bVar1 * auVar11._4_4_ | (uint)!bVar1 * 0x30;
        bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
        uStack_d8 = (uint)bVar1 * auVar11._8_4_ | (uint)!bVar1 * 0x30;
        bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
        uStack_d4 = (uint)bVar1 * auVar11._12_4_ | (uint)!bVar1 * 0x30;
        bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
        uStack_d0 = (uint)bVar1 * auVar11._16_4_ | (uint)!bVar1 * 0x30;
        bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
        uStack_cc = (uint)bVar1 * auVar11._20_4_ | (uint)!bVar1 * 0x30;
        bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
        uStack_c8 = (uint)bVar1 * auVar11._24_4_ | (uint)!bVar1 * 0x30;
        bVar1 = SUB81(uVar2 >> 7,0);
        uStack_c4 = (uint)bVar1 * auVar11._28_4_ | (uint)!bVar1 * 0x30;
        auVar10 = ZEXT832(0) << 0x20;
        uVar2 = vcmpps_avx512vl(ZEXT1632(auVar5),auVar10,5);
        auVar11 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar1 = (bool)((byte)uVar2 & 1);
        local_c0 = (uint)bVar1 * auVar11._0_4_ | (uint)!bVar1 * 0x50;
        bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
        uStack_bc = (uint)bVar1 * auVar11._4_4_ | (uint)!bVar1 * 0x50;
        bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
        uStack_b8 = (uint)bVar1 * auVar11._8_4_ | (uint)!bVar1 * 0x50;
        bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
        uStack_b4 = (uint)bVar1 * auVar11._12_4_ | (uint)!bVar1 * 0x50;
        bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
        uStack_b0 = (uint)bVar1 * auVar11._16_4_ | (uint)!bVar1 * 0x50;
        bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
        uStack_ac = (uint)bVar1 * auVar11._20_4_ | (uint)!bVar1 * 0x50;
        bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
        uStack_a8 = (uint)bVar1 * auVar11._24_4_ | (uint)!bVar1 * 0x50;
        bVar1 = SUB81(uVar2 >> 7,0);
        uStack_a4 = (uint)bVar1 * auVar11._28_4_ | (uint)!bVar1 * 0x50;
        auVar11 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar10);
        local_a0 = (uint)(bVar7 & 1) * auVar11._0_4_ | (uint)!(bool)(bVar7 & 1) * 0x7f800000;
        bVar1 = (bool)((byte)(uVar6 >> 1) & 1);
        uStack_9c = (uint)bVar1 * auVar11._4_4_ | (uint)!bVar1 * 0x7f800000;
        bVar1 = (bool)((byte)(uVar6 >> 2) & 1);
        uStack_98 = (uint)bVar1 * auVar11._8_4_ | (uint)!bVar1 * 0x7f800000;
        bVar1 = (bool)((byte)(uVar6 >> 3) & 1);
        uStack_94 = (uint)bVar1 * auVar11._12_4_ | (uint)!bVar1 * 0x7f800000;
        bVar1 = (bool)((byte)(uVar6 >> 4) & 1);
        uStack_90 = (uint)bVar1 * auVar11._16_4_ | (uint)!bVar1 * 0x7f800000;
        bVar1 = (bool)((byte)(uVar6 >> 5) & 1);
        uStack_8c = (uint)bVar1 * auVar11._20_4_ | (uint)!bVar1 * 0x7f800000;
        bVar1 = (bool)((byte)(uVar6 >> 6) & 1);
        uStack_88 = (uint)bVar1 * auVar11._24_4_ | (uint)!bVar1 * 0x7f800000;
        bVar1 = SUB81(uVar6 >> 7,0);
        uStack_84 = (uint)bVar1 * auVar11._28_4_ | (uint)!bVar1 * 0x7f800000;
        auVar11 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar10);
        local_80 = (uint)(bVar7 & 1) * auVar11._0_4_ | (uint)!(bool)(bVar7 & 1) * -0x800000;
        bVar1 = (bool)((byte)(uVar6 >> 1) & 1);
        uStack_7c = (uint)bVar1 * auVar11._4_4_ | (uint)!bVar1 * -0x800000;
        bVar1 = (bool)((byte)(uVar6 >> 2) & 1);
        uStack_78 = (uint)bVar1 * auVar11._8_4_ | (uint)!bVar1 * -0x800000;
        bVar1 = (bool)((byte)(uVar6 >> 3) & 1);
        uStack_74 = (uint)bVar1 * auVar11._12_4_ | (uint)!bVar1 * -0x800000;
        bVar1 = (bool)((byte)(uVar6 >> 4) & 1);
        uStack_70 = (uint)bVar1 * auVar11._16_4_ | (uint)!bVar1 * -0x800000;
        bVar1 = (bool)((byte)(uVar6 >> 5) & 1);
        uStack_6c = (uint)bVar1 * auVar11._20_4_ | (uint)!bVar1 * -0x800000;
        bVar1 = (bool)((byte)(uVar6 >> 6) & 1);
        uStack_68 = (uint)bVar1 * auVar11._24_4_ | (uint)!bVar1 * -0x800000;
        bVar1 = SUB81(uVar6 >> 7,0);
        uStack_64 = (uint)bVar1 * auVar11._28_4_ | (uint)!bVar1 * -0x800000;
        uStack_144 = local_280._28_4_;
        uStack_124 = local_280._60_4_;
        uStack_104 = local_280._92_4_;
        for (; uVar6 != 0; uVar6 = uVar6 - 1 & uVar6) {
          k = 0;
          for (uVar2 = uVar6; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x8000000000000000) {
            k = k + 1;
          }
          intersect1(local_288,bvh,(NodeRef)(bvh->root).ptr,k,&local_291,local_290,
                     (TravRayK<8,_false> *)&local_280.field_0,context);
        }
      }
    }
    else {
      intersectCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }